

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGhsMultiGenerator::ComputeObjectFilenames
          (cmLocalGhsMultiGenerator *this,
          map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *mapping,cmGeneratorTarget *gt)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  cmSourceFile *pcVar3;
  string *psVar4;
  mapped_type_conflict1 *pmVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  bool keptSourceExtension;
  string objectNameLower;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  counts;
  string dir_max;
  string local_160;
  undefined1 local_140 [48];
  cmAlphaNum local_110;
  string local_e0;
  string local_c0;
  string local_a0;
  undefined1 local_80 [16];
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  size_t local_58;
  string local_50;
  
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(&this->super_cmLocalGenerator);
  local_80._8_8_ = (psVar4->_M_dataplus)._M_p;
  local_80._0_8_ = psVar4->_M_string_length;
  local_140._8_8_ = local_140 + 0x10;
  local_140._0_8_ = (pointer)0x1;
  local_140[0x10] = '/';
  (*(this->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])(&local_110,this,gt);
  local_c0._M_dataplus._M_p._0_1_ = 0x2f;
  cmStrCat<std::__cxx11::string,char>
            (&local_50,(cmAlphaNum *)local_80,(cmAlphaNum *)local_140,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110,
             (char *)&local_c0);
  std::__cxx11::string::~string((string *)&local_110);
  local_68 = (_Base_ptr)(local_80 + 8);
  local_80._8_8_ = local_80._8_8_ & 0xffffffff00000000;
  local_70 = (_Base_ptr)0x0;
  local_58 = 0;
  p_Var1 = &(mapping->_M_t)._M_impl.super__Rb_tree_header;
  local_60 = local_68;
  for (p_Var6 = (mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    pcVar3 = *(cmSourceFile **)(p_Var6 + 1);
    psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar3);
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_e0,psVar4);
    cmsys::SystemTools::LowerCase(&local_160,&local_e0);
    local_140._0_8_ = local_160._M_string_length;
    local_140._8_8_ = local_160._M_dataplus._M_p;
    cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
              (&local_a0,(this->super_cmLocalGenerator).GlobalGenerator,pcVar3);
    local_110.View_._M_len = local_a0._M_string_length;
    local_110.View_._M_str = local_a0._M_dataplus._M_p;
    cmStrCat<>(&local_c0,(cmAlphaNum *)local_140,&local_110);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_e0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)local_80,&local_c0);
    *pmVar5 = *pmVar5 + 1;
    std::__cxx11::string::~string((string *)&local_c0);
  }
  for (p_Var7 = (mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    pcVar3 = *(cmSourceFile **)(p_Var7 + 1);
    psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(pcVar3);
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_160,psVar4);
    local_140._0_8_ = local_160._M_string_length;
    local_140._8_8_ = local_160._M_dataplus._M_p;
    cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
              (&local_e0,(this->super_cmLocalGenerator).GlobalGenerator,pcVar3);
    local_110.View_._M_len = local_e0._M_string_length;
    local_110.View_._M_str = local_e0._M_dataplus._M_p;
    cmStrCat<>(&local_c0,(cmAlphaNum *)local_140,&local_110);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_160);
    cmsys::SystemTools::LowerCase((string *)local_140,&local_c0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)local_80,(key_type *)local_140);
    iVar2 = *pmVar5;
    std::__cxx11::string::~string((string *)local_140);
    if (1 < iVar2) {
      cmGeneratorTarget::AddExplicitObjectName(gt,pcVar3);
      cmLocalGenerator::GetObjectFileNameWithoutTarget
                ((string *)local_140,&this->super_cmLocalGenerator,pcVar3,&local_50,
                 (bool *)&local_110,(char *)0x0);
      std::__cxx11::string::operator=((string *)&local_c0,(string *)local_140);
      std::__cxx11::string::~string((string *)local_140);
      cmsys::SystemTools::ReplaceString(&local_c0,"/","_");
    }
    std::__cxx11::string::_M_assign((string *)&p_Var7[1]._M_parent);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_80);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmLocalGhsMultiGenerator::ComputeObjectFilenames(
  std::map<cmSourceFile const*, std::string>& mapping,
  cmGeneratorTarget const* gt)
{
  std::string dir_max = cmStrCat(this->GetCurrentBinaryDirectory(), '/',
                                 this->GetTargetDirectory(gt), '/');

  // Count the number of object files with each name.  Note that
  // filesystem may not be case sensitive.
  std::map<std::string, int> counts;

  for (auto const& si : mapping) {
    cmSourceFile const* sf = si.first;
    std::string objectNameLower = cmStrCat(
      cmSystemTools::LowerCase(
        cmSystemTools::GetFilenameWithoutLastExtension(sf->GetFullPath())),
      this->GlobalGenerator->GetLanguageOutputExtension(*sf));
    counts[objectNameLower] += 1;
  }

  // For all source files producing duplicate names we need unique
  // object name computation.
  for (auto& si : mapping) {
    cmSourceFile const* sf = si.first;
    std::string objectName = cmStrCat(
      cmSystemTools::GetFilenameWithoutLastExtension(sf->GetFullPath()),
      this->GlobalGenerator->GetLanguageOutputExtension(*sf));

    if (counts[cmSystemTools::LowerCase(objectName)] > 1) {
      const_cast<cmGeneratorTarget*>(gt)->AddExplicitObjectName(sf);
      bool keptSourceExtension;
      objectName = this->GetObjectFileNameWithoutTarget(*sf, dir_max,
                                                        &keptSourceExtension);
      cmsys::SystemTools::ReplaceString(objectName, "/", "_");
    }
    si.second = objectName;
  }
}